

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

CURLsslset curl_global_sslset(curl_sslbackend id,char *name,curl_ssl_backend ***avail)

{
  atomic_int aVar1;
  CURLsslset CVar2;
  
  aVar1 = s_lock;
  LOCK();
  s_lock = 1;
  UNLOCK();
  if (aVar1 != 0) {
    do {
    } while( true );
  }
  CVar2 = Curl_init_sslset_nolock(id,name,avail);
  s_lock = 0;
  return CVar2;
}

Assistant:

CURLsslset curl_global_sslset(curl_sslbackend id, const char *name,
                              const curl_ssl_backend ***avail)
{
  CURLsslset rc;

  global_init_lock();

  rc = Curl_init_sslset_nolock(id, name, avail);

  global_init_unlock();

  return rc;
}